

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_bind_state.cpp
# Opt level: O1

void __thiscall duckdb::SelectBindState::SetExpressionIsVolatile(SelectBindState *this,idx_t index)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  pointer pcVar3;
  BinderException *this_00;
  reference this_01;
  pointer pPVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __hashtable *__h;
  __node_gen_type __node_gen;
  idx_t local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = (this->referenced_aliases)._M_h._M_bucket_count;
  uVar5 = index % uVar1;
  p_Var6 = (this->referenced_aliases)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var6->_M_nxt[1]._M_nxt != (_Hash_node_base *)index
     )) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var2[1]._M_nxt == (_Hash_node_base *)index)) goto LAB_0072d3f6;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0072d3f6:
  local_70 = index;
  if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Alias \"%s\" referenced - but the expression has side effects. This is not yet supported."
               ,"");
    this_01 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&this->original_expressions,local_70);
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_01);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar3 = (pPVar4->super_BaseExpression).alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar3,
               pcVar3 + (pPVar4->super_BaseExpression).alias._M_string_length);
    BinderException::BinderException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_68._M_dataplus._M_p = (pointer)&this->volatile_expressions;
  ::std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_68._M_dataplus._M_p,&local_70);
  return;
}

Assistant:

void SelectBindState::SetExpressionIsVolatile(idx_t index) {
	// check if this expression has been referenced before
	if (referenced_aliases.find(index) != referenced_aliases.end()) {
		throw BinderException("Alias \"%s\" referenced - but the expression has side "
		                      "effects. This is not yet supported.",
		                      original_expressions[index]->GetAlias());
	}
	volatile_expressions.insert(index);
}